

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock.cc
# Opt level: O0

attributes_t * __thiscall tchecker::system::clocks_t::clock_attributes(clocks_t *this,clock_id_t id)

{
  size_type sVar1;
  invalid_argument *this_00;
  const_reference pvVar2;
  clock_id_t id_local;
  clocks_t *this_local;
  
  sVar1 = std::
          vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
          size(&this->_clock_variables_attributes);
  if (sVar1 <= id) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Unknown clock variable identifier");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar2 = std::
           vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
           operator[](&this->_clock_variables_attributes,(ulong)id);
  return pvVar2;
}

Assistant:

tchecker::system::attributes_t const & clocks_t::clock_attributes(tchecker::clock_id_t id) const
{
  if (id >= _clock_variables_attributes.size())
    throw std::invalid_argument("Unknown clock variable identifier");
  return _clock_variables_attributes[id];
}